

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Httpd.cpp
# Opt level: O0

int __thiscall xmrig::Httpd::auth(Httpd *this,HttpData *req)

{
  undefined *puVar1;
  bool bVar2;
  int iVar3;
  Config *this_00;
  size_type sVar4;
  String *pSVar5;
  mapped_type *pmVar6;
  long lVar7;
  ulong uVar8;
  size_t sVar9;
  void *__s2;
  char *__s1;
  char *__s2_00;
  long in_RDI;
  size_t size;
  string *token;
  Http *config;
  Http *in_stack_ffffffffffffff20;
  key_type *in_stack_ffffffffffffff28;
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff30;
  key_type *__k;
  allocator *this_01;
  allocator local_81;
  string local_80 [32];
  mapped_type *local_60;
  allocator local_41;
  string local_40 [32];
  Http *local_20;
  int local_4;
  
  this_00 = Base::config(*(Base **)(in_RDI + 0x10));
  local_20 = BaseConfig::http(&this_00->super_BaseConfig);
  puVar1 = kAuthorization;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,puVar1,&local_41);
  sVar4 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (sVar4 == 0) {
    bVar2 = Http::isAuthRequired(in_stack_ffffffffffffff20);
    local_4 = 200;
    if (bVar2) {
      local_4 = 0x191;
    }
  }
  else {
    pSVar5 = Http::token(local_20);
    bVar2 = String::isNull(pSVar5);
    if (bVar2) {
      local_4 = 0x191;
    }
    else {
      this_01 = &local_81;
      __k = (key_type *)kAuthorization;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_80,(char *)__k,this_01);
      pmVar6 = std::
               map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::at((map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)this_01,__k);
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      local_60 = pmVar6;
      lVar7 = std::__cxx11::string::size();
      uVar8 = std::__cxx11::string::size();
      if (7 < uVar8) {
        pSVar5 = Http::token(local_20);
        sVar9 = String::size(pSVar5);
        if (sVar9 == lVar7 - 7U) {
          __s2 = (void *)std::__cxx11::string::c_str();
          iVar3 = memcmp("Bearer ",__s2,7);
          if (iVar3 == 0) {
            pSVar5 = Http::token(local_20);
            __s1 = String::data(pSVar5);
            lVar7 = std::__cxx11::string::c_str();
            __s2_00 = (char *)(lVar7 + 7);
            pSVar5 = Http::token(local_20);
            sVar9 = String::size(pSVar5);
            iVar3 = strncmp(__s1,__s2_00,sVar9);
            if (iVar3 != 0) {
              return 0x193;
            }
            return 200;
          }
        }
      }
      local_4 = 0x193;
    }
  }
  return local_4;
}

Assistant:

int xmrig::Httpd::auth(const HttpData &req) const
{
    const Http &config = m_base->config()->http();

    if (!req.headers.count(kAuthorization)) {
        return config.isAuthRequired() ? HTTP_STATUS_UNAUTHORIZED : HTTP_STATUS_OK;
    }

    if (config.token().isNull()) {
        return HTTP_STATUS_UNAUTHORIZED;
    }

    const std::string &token = req.headers.at(kAuthorization);
    const size_t size        = token.size();

    if (token.size() < 8 || config.token().size() != size - 7 || memcmp("Bearer ", token.c_str(), 7) != 0) {
        return HTTP_STATUS_FORBIDDEN;
    }

    return strncmp(config.token().data(), token.c_str() + 7, config.token().size()) == 0 ? HTTP_STATUS_OK : HTTP_STATUS_FORBIDDEN;
}